

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O1

void __thiscall
NDeviceChannel::serialize<cereal::PortableBinaryOutputArchive>
          (NDeviceChannel *this,PortableBinaryOutputArchive *archive)

{
  PortableBinaryOutputArchive *pPVar1;
  PortableBinaryOutputArchive *pPVar2;
  size_type local_38;
  
  pPVar1 = (archive->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  pPVar2 = (((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_38 = (this->id)._M_string_length;
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar2->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_38,8);
  cereal::PortableBinaryOutputArchive::saveBinary<1ul>
            ((((((pPVar2->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             (this->id)._M_dataplus._M_p,(this->id)._M_string_length);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&this->startByte,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&this->startBit,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&this->type,4);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             &this->interleavedDataByte,4);
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             &this->interleavedDataBit,4);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, startByte, startBit, type, interleavedDataByte, interleavedDataBit);
    }